

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem-C-API.cpp
# Opt level: O3

void anon_unknown.dwarf_98ca::fs_get_file_info
               (void *context,char *path,llb_fs_file_info_t *file_info_out)

{
  int iVar1;
  stat buf;
  stat local_a8;
  
  printf(" -- stat: %s\n");
  fflush(_stdout);
  iVar1 = stat(path,&local_a8);
  if (iVar1 == 0) {
    file_info_out->device = local_a8.st_dev;
    file_info_out->inode = local_a8.st_ino;
    file_info_out->size = local_a8.st_size;
    (file_info_out->mod_time).seconds = local_a8.st_mtim.tv_sec;
    (file_info_out->mod_time).nanoseconds = 0;
  }
  else {
    (file_info_out->mod_time).seconds = 0;
    (file_info_out->mod_time).nanoseconds = 0;
    file_info_out->mode = 0;
    file_info_out->size = 0;
    file_info_out->device = 0;
    file_info_out->inode = 0;
  }
  return;
}

Assistant:

static void fs_get_file_info(void* context, const char* path,
                             llb_fs_file_info_t* file_info_out) {
  printf(" -- stat: %s\n", path);
  fflush(stdout);
  
  struct stat buf;
  if (stat(path, &buf) != 0) {
    memset(file_info_out, 0, sizeof(*file_info_out));
    return;
  }
  
  file_info_out->device = buf.st_dev;
  file_info_out->inode = buf.st_ino;
  file_info_out->size = buf.st_size;
  file_info_out->mod_time.seconds = buf.st_mtime;
  file_info_out->mod_time.nanoseconds = 0;
}